

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modules.c
# Opt level: O0

translation_module_t * modules_init(void)

{
  translation_module_t *ptVar1;
  translation_module_t *modules;
  
  ptVar1 = (translation_module_t *)malloc(0x40);
  ptVar1->tagOpen = (char *)0x0;
  ptVar1->tagClose = (char *)0x0;
  ptVar1->next = (s_translation_module *)0x0;
  cchoose_register((translation_module_t *)0x10521b);
  cforeach_register((translation_module_t *)0x105224);
  cif_register((translation_module_t *)0x10522d);
  cout_register((translation_module_t *)0x105236);
  cremove_register((translation_module_t *)0x10523f);
  cset_register((translation_module_t *)0x105248);
  expression_register((translation_module_t *)0x105251);
  return ptVar1;
}

Assistant:

translation_module_t *modules_init() {
	translation_module_t *modules = (translation_module_t *) malloc(sizeof(translation_module_t));
	modules->tagOpen = NULL;
	modules->tagClose = NULL;
	modules->next = NULL;

	cchoose_register(modules);
	cforeach_register(modules);
	cif_register(modules);
	cout_register(modules);
	cremove_register(modules);
	cset_register(modules);
	expression_register(modules);

	return modules;
}